

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::see(Forth *this)

{
  undefined1 *puVar1;
  ForthStack<unsigned_int> *this_00;
  code *pcVar2;
  uint uVar3;
  Cell CVar4;
  Definition *pDVar5;
  ostream *poVar6;
  allocator<char> local_51;
  string local_50;
  
  bl(this);
  word(this);
  find(this);
  this_00 = &this->dStack;
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  if (uVar3 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"SEE: undefined word",&local_51);
    throwMessage(this,&local_50,errorParsedStringOverflow);
    std::__cxx11::string::~string((string *)&local_50);
    return;
  }
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  pDVar5 = getDefinition(this,uVar3);
  pcVar2 = (code *)pDVar5->code;
  if (pcVar2 == doColon && *(long *)&pDVar5->field_0x8 == 0) {
    CVar4 = getNumericBase(this);
    poVar6 = std::operator<<(&this->field_0x20,CVar4);
    std::ostream::operator<<(poVar6,pDVar5->does);
    poVar6 = std::operator<<((ostream *)&this->field_0x20," : ");
    std::operator<<(poVar6,(string *)&pDVar5->name);
  }
  else {
    puVar1 = &this->field_0x20;
    if (pcVar2 != doDoes && pcVar2 != doCreate || *(long *)&pDVar5->field_0x8 != 0) {
      poVar6 = std::operator<<((ostream *)puVar1,": ");
      poVar6 = std::operator<<(poVar6,(string *)&pDVar5->name);
      poVar6 = std::operator<<(poVar6," <primitive ");
      CVar4 = getNumericBase(this);
      poVar6 = std::operator<<(poVar6,CVar4);
      poVar6 = std::operator<<(poVar6,"addr of proc is not defined ");
      std::operator<<(poVar6,"> ;");
      goto LAB_001105d0;
    }
    poVar6 = std::operator<<((ostream *)puVar1,"CREATE ");
    poVar6 = std::operator<<(poVar6,(string *)&pDVar5->name);
    poVar6 = std::operator<<(poVar6," ( ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::operator<<(poVar6," )");
    if (((code *)pDVar5->code != doDoes) || (*(long *)&pDVar5->field_0x8 != 0)) goto LAB_001105d0;
    std::operator<<((ostream *)puVar1," DOES>");
  }
  seeDoes(this,pDVar5->does);
LAB_001105d0:
  if ((pDVar5->flags & pDVar5->FlagImmediate) == 0) {
    return;
  }
  std::operator<<((ostream *)&this->field_0x20," immediate");
  return;
}

Assistant:

void see() {
			bl(); word(); find();

			auto found = dStack.getTop(); pop();
			if (!found) {
				throwMessage("SEE: undefined word",errorParsedStringOverflow);
				return;
			}
			auto xt=XT(dStack.getTop()); dStack.pop();
			auto defn = getDefinition(xt); 
			if ((defn)->code == &Forth::doColon) {
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
				std_cout <<  SETBASE() << static_cast<SCell>(defn->does);
				std_cout << " : " << (defn)->name;
#endif
				seeDoes((defn)->does);
			}
			else if ((defn)->code == &Forth::doCreate || defn->code == &Forth::doDoes) {
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
				std_cout << "CREATE " << defn->name << " ( " << CELL(defn->parameter) << " )";
				if (defn->code == &Forth::doDoes) {
					std_cout << " DOES>";
					seeDoes(defn->does);
				}
#endif
			}
			else {
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
				std_cout << ": " << defn->name << " <primitive " << SETBASE() << "addr of proc is not defined " << "> ;";
#endif
			}
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			if (defn->isImmediate()) std_cout << " immediate";
#endif
		}